

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  XMLError error;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  string filename;
  VideoHppGenerator generator;
  XMLDocument doc;
  
  if ((argc & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "VideoHppGenerator usage: VideoHppGenerator [-f filename]");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"\tdefault for filename is <");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
                            );
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
               ,(allocator<char> *)&doc);
    for (lVar4 = 1; lVar4 < argc; lVar4 = lVar4 + 2) {
      pcVar1 = argv[lVar4];
      if (((*pcVar1 != '-') || (pcVar1[1] != 'f')) || (pcVar1[2] != '\0')) {
        poVar2 = std::operator<<((ostream *)&std::cout,"unsupported argument <");
        poVar2 = std::operator<<(poVar2,argv[lVar4]);
        poVar2 = std::operator<<(poVar2,">");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar3 = -1;
        goto LAB_00110c12;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&filename,argv[lVar4 + 1]);
    }
    tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
    poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: Loading ");
    poVar2 = std::operator<<(poVar2,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    error = tinyxml2::XMLDocument::LoadFile(&doc,filename._M_dataplus._M_p);
    if (error == XML_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: Parsing ");
      poVar2 = std::operator<<(poVar2,(string *)&filename);
      std::endl<char,std::char_traits<char>>(poVar2);
      VideoHppGenerator::VideoHppGenerator(&generator,&doc);
      VideoHppGenerator::generateHppFile(&generator);
      std::operator<<((ostream *)&std::cout,
                      "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
                     );
      VideoHppGenerator::~VideoHppGenerator(&generator);
      iVar3 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: failed to load file ");
      poVar2 = std::operator<<(poVar2,(string *)&filename);
      poVar2 = std::operator<<(poVar2," with error <");
      toString_abi_cxx11_(&generator.m_copyrightMessage,error);
      poVar2 = std::operator<<(poVar2,(string *)&generator);
      poVar2 = std::operator<<(poVar2,">");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&generator);
      iVar3 = -1;
    }
    tinyxml2::XMLDocument::~XMLDocument(&doc);
LAB_00110c12:
    std::__cxx11::string::~string((string *)&filename);
  }
  return iVar3;
}

Assistant:

int main( int argc, char ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VideoHppGenerator usage: VideoHppGenerator [-f filename]" << std::endl;
    std::cout << "\tdefault for filename is <" << VIDEO_SPEC << ">" << std::endl;
    return -1;
  }

  std::string filename = VIDEO_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VideoHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VideoHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VideoHppGenerator: Loading " << filename << std::endl;
  tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VideoHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VideoHppGenerator: Parsing " << filename << std::endl;
    VideoHppGenerator generator( doc );

    generator.generateHppFile();

#if !defined( CLANG_FORMAT_EXECUTABLE )
    std::cout << "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
  return 0;
}